

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O2

void EpdGetValueAndDecimalExponent(EpDouble *epd,double *value,int *exponent)

{
  EpDouble epd2;
  EpDouble epd1;
  EpDouble local_40;
  EpTypeUnion local_30;
  int local_28;
  
  local_30.bits = *(IeeeDoubleStruct *)&epd->type;
  if (((ulong)local_30 & 0x7ff7ffffffffffff) != 0x7ff0000000000000 ||
      ((ulong)local_30 & 0x8008000000000000) == 0x8000000000000) {
    if (ABS(local_30.value) == 0.0) {
      *value = 0.0;
      local_28 = 0;
    }
    else {
      local_28 = 0;
      EpdPow2Decimal(epd->exponent,&local_40);
      EpdMultiply2Decimal((EpDouble *)&local_30.bits,&local_40);
      *value = (double)local_30;
    }
    *exponent = local_28;
  }
  return;
}

Assistant:

void
EpdGetValueAndDecimalExponent(EpDouble *epd, double *value, int *exponent)
{
  EpDouble      epd1, epd2;

  if (EpdIsNanOrInf(epd))
    return;

  if (EpdIsZero(epd)) {
    *value = 0.0;
    *exponent = 0;
    return;
  }

  epd1.type.value = epd->type.value;
  epd1.exponent = 0;
  EpdPow2Decimal(epd->exponent, &epd2);
  EpdMultiply2Decimal(&epd1, &epd2);

  *value = epd1.type.value;
  *exponent = epd1.exponent;
}